

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemImpl.cpp
# Opt level: O2

void efsw::Platform::System::maxFD(void)

{
  rlimit limit;
  
  if (maxFD()::maxed == '\0') {
    getrlimit(RLIMIT_NOFILE,(rlimit *)&limit);
    limit.rlim_cur = limit.rlim_max;
    setrlimit(RLIMIT_NOFILE,(rlimit *)&limit);
    getrlimit(RLIMIT_NOFILE,(rlimit *)&limit);
    maxFD()::maxed = '\x01';
  }
  return;
}

Assistant:

void System::maxFD() {
	static bool maxed = false;

	if ( !maxed ) {
		struct rlimit limit;
		getrlimit( RLIMIT_NOFILE, &limit );
		limit.rlim_cur = limit.rlim_max;
		setrlimit( RLIMIT_NOFILE, &limit );

		getrlimit( RLIMIT_NOFILE, &limit );

		efDEBUG( "File descriptor limit %ld\n", limit.rlim_cur );

		maxed = true;
	}
}